

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O2

void __thiscall MIDI::Track::Track(Track *this,byte *data,dword size)

{
  dword *pdVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  undefined8 uVar5;
  vector<MIDI::Event*,std::allocator<MIDI::Event*>> *pvVar6;
  uint uVar7;
  ulong uVar8;
  dword dVar9;
  dword dVar10;
  MetaTextEvent *pMVar11;
  dword dVar12;
  byte bVar13;
  undefined1 *puVar14;
  long lVar15;
  byte bVar16;
  byte *data_00;
  bool bVar17;
  undefined1 auStack_68 [8];
  undefined1 *local_60;
  MetaTextEvent *local_58;
  vector<MIDI::Event*,std::allocator<MIDI::Event*>> *local_50;
  uint local_44;
  dword local_40;
  uint local_38;
  byte local_31;
  
  puVar14 = auStack_68;
  Chunk::Chunk(&this->super_Chunk);
  (this->super_Chunk)._vptr_Chunk = (_func_int **)&PTR_data_0010ab98;
  this->_data = data;
  this->_size = size;
  pdVar1 = &this->_pos;
  local_50 = (vector<MIDI::Event*,std::allocator<MIDI::Event*>> *)&this->_events;
  this->_pos = 0;
  (this->_events).super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_events).super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_events).super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = 0;
  while (uVar8 < size) {
    *(undefined8 *)(puVar14 + -8) = 0x106137;
    dVar9 = readNextVariableLength(this);
    pbVar4 = this->_data;
    dVar10 = this->_pos;
    bVar13 = pbVar4[dVar10];
    dVar12 = dVar10 + 1;
    this->_pos = dVar12;
    if ((bVar13 == 0xf0) || (bVar13 == 0xf7)) {
      *(undefined8 *)(puVar14 + -8) = 0x1061cb;
      dVar10 = readNextVariableLength(this);
      dVar12 = this->_pos;
      while( true ) {
        dVar12 = dVar12 + 1;
        bVar17 = dVar10 == 0;
        dVar10 = dVar10 - 1;
        if (bVar17) break;
        *pdVar1 = dVar12;
      }
    }
    else {
      local_40 = dVar9;
      if (bVar13 == 0xff) {
        local_38 = (uint)pbVar4[dVar10 + 1];
        this->_pos = dVar10 + 2;
        *(undefined8 *)(puVar14 + -8) = 0x106181;
        dVar10 = readNextVariableLength(this);
        local_60 = puVar14;
        lVar15 = -(dVar10 + 0xf & 0xfffffffffffffff0);
        data_00 = puVar14 + lVar15;
        dVar12 = this->_pos;
        pbVar4 = this->_data;
        for (dVar9 = 0; uVar7 = local_38, dVar10 != dVar9; dVar9 = dVar9 + 1) {
          bVar2 = pbVar4[dVar9 + dVar12];
          *pdVar1 = dVar12 + 1 + dVar9;
          data_00[dVar9] = bVar2;
        }
        if ((local_38 < 7) &&
           (data_00[-8] = 'N', data_00[-7] = '\0', data_00[-6] = '\0', data_00[-5] = '\0',
           data_00[-4] = '\0', data_00[-3] = '\0', data_00[-2] = '\0', data_00[-1] = '\0',
           ((uint)*(undefined8 *)(data_00 + -8) >> (uVar7 & 0x1f) & 1) != 0)) {
          data_00[-8] = '8';
          data_00[-7] = '\0';
          data_00[-6] = '\0';
          data_00[-5] = '\0';
          data_00[-4] = '\0';
          data_00[-3] = '\0';
          data_00[-2] = '\0';
          data_00[-1] = '\0';
          builtin_memcpy(puVar14 + lVar15 + -8,"\x0eb\x10",4);
          data_00[-4] = '\0';
          data_00[-3] = '\0';
          data_00[-2] = '\0';
          data_00[-1] = '\0';
          pMVar11 = (MetaTextEvent *)operator_new(*(ulong *)(data_00 + -8));
          uVar7 = local_38;
          dVar12 = local_40;
          builtin_memcpy(puVar14 + lVar15 + -8,"&b\x10",4);
          data_00[-4] = '\0';
          data_00[-3] = '\0';
          data_00[-2] = '\0';
          data_00[-1] = '\0';
          MetaTextEvent::MetaTextEvent(pMVar11,dVar12,(byte)uVar7,data_00,dVar10);
        }
        else if (uVar7 == 0x51) {
          data_00[-8] = ' ';
          data_00[-7] = '\0';
          data_00[-6] = '\0';
          data_00[-5] = '\0';
          data_00[-4] = '\0';
          data_00[-3] = '\0';
          data_00[-2] = '\0';
          data_00[-1] = '\0';
          uVar8 = *(ulong *)(data_00 + -8);
          data_00[-8] = 0xc5;
          data_00[-7] = 'b';
          data_00[-6] = '\x10';
          data_00[-5] = '\0';
          data_00[-4] = '\0';
          data_00[-3] = '\0';
          data_00[-2] = '\0';
          data_00[-1] = '\0';
          pMVar11 = (MetaTextEvent *)operator_new(uVar8);
          dVar12 = local_40;
          data_00[-8] = 'Q';
          data_00[-7] = '\0';
          data_00[-6] = '\0';
          data_00[-5] = '\0';
          data_00[-4] = '\0';
          data_00[-3] = '\0';
          data_00[-2] = '\0';
          data_00[-1] = '\0';
          uVar5 = *(undefined8 *)(data_00 + -8);
          data_00[-8] = 0xdd;
          data_00[-7] = 'b';
          data_00[-6] = '\x10';
          data_00[-5] = '\0';
          data_00[-4] = '\0';
          data_00[-3] = '\0';
          data_00[-2] = '\0';
          data_00[-1] = '\0';
          MetaNumberEvent::MetaNumberEvent
                    ((MetaNumberEvent *)pMVar11,dVar12,(byte)uVar5,data_00,dVar10);
        }
        else {
          data_00[-8] = '(';
          data_00[-7] = '\0';
          data_00[-6] = '\0';
          data_00[-5] = '\0';
          data_00[-4] = '\0';
          data_00[-3] = '\0';
          data_00[-2] = '\0';
          data_00[-1] = '\0';
          uVar8 = *(ulong *)(data_00 + -8);
          data_00[-8] = 0xe7;
          data_00[-7] = 'b';
          data_00[-6] = '\x10';
          data_00[-5] = '\0';
          data_00[-4] = '\0';
          data_00[-3] = '\0';
          data_00[-2] = '\0';
          data_00[-1] = '\0';
          pMVar11 = (MetaTextEvent *)operator_new(uVar8);
          uVar7 = local_38;
          dVar12 = local_40;
          data_00[-8] = 0xff;
          data_00[-7] = 'b';
          data_00[-6] = '\x10';
          data_00[-5] = '\0';
          data_00[-4] = '\0';
          data_00[-3] = '\0';
          data_00[-2] = '\0';
          data_00[-1] = '\0';
          MetaGenericEvent::MetaGenericEvent
                    ((MetaGenericEvent *)pMVar11,dVar12,(byte)uVar7,data_00,(int)dVar10);
        }
        pvVar6 = local_50;
        local_58 = pMVar11;
        builtin_memcpy(puVar14 + lVar15 + -8,"\x10c\x10",4);
        data_00[-4] = '\0';
        data_00[-3] = '\0';
        data_00[-2] = '\0';
        data_00[-1] = '\0';
        std::vector<MIDI::Event*,std::allocator<MIDI::Event*>>::emplace_back<MIDI::Event*>
                  (pvVar6,(Event **)&local_58);
        puVar14 = local_60;
      }
      else {
        if ((char)bVar13 < '\0') {
          bVar16 = bVar13 >> 4;
          local_44 = bVar13 & 0xf;
          bVar13 = pbVar4[dVar10 + 1];
          dVar12 = dVar10 + 2;
          *pdVar1 = dVar12;
          *(undefined8 *)(puVar14 + -8) = 3;
          lVar15 = *(long *)(puVar14 + -8);
        }
        else {
          *(undefined8 *)(puVar14 + -8) = 2;
          lVar15 = *(long *)(puVar14 + -8);
          bVar16 = local_31;
        }
        bVar3 = pbVar4[dVar12];
        *pdVar1 = dVar10 + lVar15;
        local_31 = bVar16;
        if (bVar16 == 0xb) {
          *(undefined8 *)(puVar14 + -8) = 0x28;
          uVar8 = *(ulong *)(puVar14 + -8);
          *(undefined8 *)(puVar14 + -8) = 0x106267;
          pMVar11 = (MetaTextEvent *)operator_new(uVar8);
          dVar12 = local_40;
          uVar7 = local_44;
          *(undefined8 *)(puVar14 + -8) = 0x10627f;
          ChannelControllerEvent::ChannelControllerEvent
                    ((ChannelControllerEvent *)pMVar11,dVar12,uVar7,(uint)bVar13,(uint)bVar3);
        }
        else {
          *(undefined8 *)(puVar14 + -8) = 0x20;
          uVar8 = *(ulong *)(puVar14 + -8);
          *(undefined8 *)(puVar14 + -8) = 0x106289;
          pMVar11 = (MetaTextEvent *)operator_new(uVar8);
          bVar16 = local_31;
          dVar12 = local_40;
          uVar7 = local_44;
          *(undefined8 *)(puVar14 + -8) = 0x1062a5;
          ChannelEvent::ChannelEvent
                    ((ChannelEvent *)pMVar11,dVar12,bVar16,uVar7,(uint)bVar13,(uint)bVar3);
        }
        pvVar6 = local_50;
        local_58 = pMVar11;
        *(undefined8 *)(puVar14 + -8) = 0x1062b6;
        std::vector<MIDI::Event*,std::allocator<MIDI::Event*>>::emplace_back<MIDI::Event*>
                  (pvVar6,(Event **)&local_58);
      }
    }
    size = this->_size;
    uVar8 = this->_pos;
  }
  return;
}

Assistant:

Track::Track(byte* data,dword size)
    : _data(data),_size(size),_pos(0)
  {
    byte lastMIDICommand;
    int lastChannel;
    
    while(_pos<_size)
      {
	dword deltaTime=readNextVariableLength();
	byte eventType=readNextByte();
	
	switch(eventType)
	  {
	  case 0xFF: //Meta event
	    {
	      byte type=readNextByte();
	      dword length=readNextVariableLength();
	      byte metaData[length];
	      for(int i=0;i<length;i++)
		{
		  metaData[i]=readNextByte();
		}
	      
	      MetaEvent *event;
	      switch(type)
		{
		case MIDI_METAEVENT_TEXT:
		case MIDI_METAEVENT_COPYRIGHT:
		case MIDI_METAEVENT_TRACKNAME:
		case MIDI_METAEVENT_MAKER:
		  event=new MetaTextEvent(deltaTime,type,metaData,length);
		  break;
		case MIDI_METAEVENT_SETTEMPO:
		  event=new MetaNumberEvent(deltaTime,type,metaData,length);
		  break;
		default:
		  event=new MetaGenericEvent(deltaTime,type,metaData,length);
		  break;
		}
	      _events.push_back(event);
	    }
	    break;
	  case 0xF0: // System Exclusive Events
	  case 0xF7:
	    {
	      dword length=readNextVariableLength();
	      byte sysData[length];
	      for(int i=0;i<length;i++)
		{
		  sysData[i]=readNextByte();
		}
#warning "System Exclusive events are unimplemented"
	      // IGNORE
	    }
	    break;
	  default:
	    { // Everything else is a channel event
	      byte command;
	      int channel;
	      byte param1;
	      byte param2;
	      
	      if((eventType>>7)==1) // MSB of 1 indicates that the first 4 bits are the channel event type
		{
		  /*
		   * 4 bits:event type
		   * 4 bits:channel
		   * 1 byte:param1
		   * 1 byte:param2
		   */
		  command=(0xF0&eventType)>>4;
		  channel=(int)(0x0F & eventType);
		  param1=readNextByte();
		  param2=readNextByte();
		}
	      else // This is a running status, since MSB==0
		{
		  /*
		   * Event type/channel are from previous event
		   * 1 byte:param1
		   * 1 byte:param2
		   */
		  command=lastMIDICommand;
		  channel=lastChannel;
		  param1=eventType;
		  param2=readNextByte();
		}
	      
	      // Store the event
	      ChannelEvent *event=0;
	      if(command==MIDI_CHEVENT_CONTROLLER)
		event=new ChannelControllerEvent(deltaTime,channel,param1,param2);
	      else
		event=new ChannelEvent(deltaTime,command,channel,param1,param2);
	      
	      _events.push_back(event);
	      
	      lastMIDICommand=command;
	      lastChannel=channel;
	    }
	    break;
	  }
      }
  }